

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_format_tar_read_header(archive_read *a,archive_entry *entry)

{
  wchar_t wVar1;
  mode_t mVar2;
  archive_string_conv *paVar3;
  wchar_t *__s;
  wchar_t *wp;
  sparse_block *sb;
  size_t unconsumed;
  size_t l;
  char *pcStack_30;
  wchar_t r;
  char *p;
  tar *tar;
  archive_entry *entry_local;
  archive_read *a_local;
  
  sb = (sparse_block *)0x0;
  tar = (tar *)entry;
  entry_local = (archive_entry *)a;
  archive_entry_set_dev(entry,(long)(archive_read_format_tar_read_header::default_dev + L'\x01'));
  archive_read_format_tar_read_header::default_inode =
       archive_read_format_tar_read_header::default_inode + L'\x01';
  archive_entry_set_ino
            ((archive_entry *)tar,(long)archive_read_format_tar_read_header::default_inode);
  if (L'\xfffe' < archive_read_format_tar_read_header::default_inode) {
    archive_read_format_tar_read_header::default_dev =
         archive_read_format_tar_read_header::default_dev + L'\x01';
    archive_read_format_tar_read_header::default_inode = L'\0';
  }
  p = *(char **)entry_local[2].ae_fflags_text.aes_mbs.buffer_length;
  ((tar *)p)->entry_offset = 0;
  gnu_clear_sparse_list((tar *)p);
  p[0x130] = -1;
  p[0x131] = -1;
  p[0x132] = -1;
  p[0x133] = -1;
  p[0x134] = -1;
  p[0x135] = -1;
  p[0x136] = -1;
  p[0x137] = -1;
  *(undefined8 *)(p + 0x188) = *(undefined8 *)(p + 0x180);
  if (*(long *)(p + 0x188) == 0) {
    if (*(int *)(p + 0x1a0) == 0) {
      paVar3 = archive_string_default_conversion_for_read((archive *)entry_local);
      *(archive_string_conv **)(p + 0x198) = paVar3;
      p[0x1a0] = '\x01';
      p[0x1a1] = '\0';
      p[0x1a2] = '\0';
      p[0x1a3] = '\0';
    }
    *(undefined8 *)(p + 0x188) = *(undefined8 *)(p + 0x198);
  }
  l._4_4_ = tar_read_header((archive_read *)entry_local,(tar *)p,(archive_entry *)tar,(size_t *)&sb)
  ;
  tar_flush_unconsumed((archive_read *)entry_local,(size_t *)&sb);
  if (*(long *)(p + 0x138) == 0) {
    wVar1 = gnu_add_sparse_entry((archive_read *)entry_local,(tar *)p,0,*(int64_t *)(p + 0x110));
    if (wVar1 != L'\0') {
      return L'\xffffffe2';
    }
  }
  else {
    for (wp = *(wchar_t **)(p + 0x138); wp != (wchar_t *)0x0; wp = *(wchar_t **)wp) {
      if (wp[6] == L'\0') {
        archive_entry_sparse_add_entry
                  ((archive_entry *)tar,*(int64_t *)(wp + 2),*(int64_t *)(wp + 4));
      }
    }
  }
  if (l._4_4_ == L'\0') {
    __s = archive_entry_pathname_w((archive_entry *)tar);
    if (__s == (wchar_t *)0x0) {
      pcStack_30 = archive_entry_pathname((archive_entry *)tar);
      if (pcStack_30 == (char *)0x0) {
        return L'\xffffffe7';
      }
      unconsumed = strlen(pcStack_30);
      mVar2 = archive_entry_filetype((archive_entry *)tar);
      if ((mVar2 == 0x8000) && (pcStack_30[unconsumed - 1] == '/')) {
        archive_entry_set_filetype((archive_entry *)tar,0x4000);
      }
    }
    else {
      unconsumed = wcslen(__s);
      mVar2 = archive_entry_filetype((archive_entry *)tar);
      if ((mVar2 == 0x8000) && (__s[unconsumed - 1] == L'/')) {
        archive_entry_set_filetype((archive_entry *)tar,0x4000);
      }
    }
  }
  return l._4_4_;
}

Assistant:

static int
archive_read_format_tar_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	/*
	 * When converting tar archives to cpio archives, it is
	 * essential that each distinct file have a distinct inode
	 * number.  To simplify this, we keep a static count here to
	 * assign fake dev/inode numbers to each tar entry.  Note that
	 * pax format archives may overwrite this with something more
	 * useful.
	 *
	 * Ideally, we would track every file read from the archive so
	 * that we could assign the same dev/ino pair to hardlinks,
	 * but the memory required to store a complete lookup table is
	 * probably not worthwhile just to support the relatively
	 * obscure tar->cpio conversion case.
	 */
	static int default_inode;
	static int default_dev;
	struct tar *tar;
	const char *p;
	int r;
	size_t l, unconsumed = 0;

	/* Assign default device/inode values. */
	archive_entry_set_dev(entry, 1 + default_dev); /* Don't use zero. */
	archive_entry_set_ino(entry, ++default_inode); /* Don't use zero. */
	/* Limit generated st_ino number to 16 bits. */
	if (default_inode >= 0xffff) {
		++default_dev;
		default_inode = 0;
	}

	tar = (struct tar *)(a->format->data);
	tar->entry_offset = 0;
	gnu_clear_sparse_list(tar);
	tar->realsize = -1; /* Mark this as "unset" */

	/* Setup default string conversion. */
	tar->sconv = tar->opt_sconv;
	if (tar->sconv == NULL) {
		if (!tar->init_default_conversion) {
			tar->sconv_default =
			    archive_string_default_conversion_for_read(&(a->archive));
			tar->init_default_conversion = 1;
		}
		tar->sconv = tar->sconv_default;
	}

	r = tar_read_header(a, tar, entry, &unconsumed);

	tar_flush_unconsumed(a, &unconsumed);

	/*
	 * "non-sparse" files are really just sparse files with
	 * a single block.
	 */
	if (tar->sparse_list == NULL) {
		if (gnu_add_sparse_entry(a, tar, 0, tar->entry_bytes_remaining)
		    != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	} else {
		struct sparse_block *sb;

		for (sb = tar->sparse_list; sb != NULL; sb = sb->next) {
			if (!sb->hole)
				archive_entry_sparse_add_entry(entry,
				    sb->offset, sb->remaining);
		}
	}

	if (r == ARCHIVE_OK) {
		/*
		 * "Regular" entry with trailing '/' is really
		 * directory: This is needed for certain old tar
		 * variants and even for some broken newer ones.
		 */
		const wchar_t *wp;
		wp = archive_entry_pathname_w(entry);
		if (wp != NULL) {
			l = wcslen(wp);
			if (archive_entry_filetype(entry) == AE_IFREG
			    && wp[l-1] == L'/')
				archive_entry_set_filetype(entry, AE_IFDIR);
		} else {
			p = archive_entry_pathname(entry);
			if (p == NULL)
				return (ARCHIVE_FAILED);
			l = strlen(p);
			if (archive_entry_filetype(entry) == AE_IFREG
			    && p[l-1] == '/')
				archive_entry_set_filetype(entry, AE_IFDIR);
		}
	}
	return (r);
}